

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

string * __thiscall
pfederc::TypeExpr::toString_abi_cxx11_(string *__return_storage_ptr__,TypeExpr *this)

{
  size_type *psVar1;
  _Head_base<0UL,_pfederc::Capabilities_*,_false> caps;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  string local_c0;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  long *local_60;
  ulong local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  caps._M_head_impl =
       (this->super_Capable).caps._M_t.
       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>.
       _M_t.
       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
       super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
  if (caps._M_head_impl != (Capabilities *)0x0) {
    _capsToString_abi_cxx11_(&local_c0,caps._M_head_impl);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  (*((this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
     _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(local_40);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x11f895);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_90 = *puVar5;
    uStack_88 = (undefined4)plVar2[3];
    uStack_84 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar5;
    local_a0 = (ulong *)*plVar2;
  }
  local_98 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (*this->tokId->_vptr_Token[2])
            (&local_80,this->tokId,
             ((this->expr)._M_t.
              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
              super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->lexer);
  uVar6 = 0xf;
  if (local_a0 != &local_90) {
    uVar6 = local_90;
  }
  if (uVar6 < (ulong)(local_78 + local_98)) {
    uVar6 = 0xf;
    if (local_80 != local_70) {
      uVar6 = local_70[0];
    }
    if ((ulong)(local_78 + local_98) <= uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0011b3cf;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
LAB_0011b3cf:
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_c0.field_2._M_allocated_capacity = *psVar1;
    local_c0.field_2._8_8_ = puVar3[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar1;
    local_c0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_c0._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypeExpr::toString() const noexcept {
  std::string result;
  if (caps)
    result += _capsToString(*caps);
  result += "type " + expr->toString() + ' ' + tokId->toString(expr->getLexer());
  return result;
}